

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multipart_test.cc
# Opt level: O0

void __thiscall
IntegrationTest_TestMultipartUpload_smallfile_Test::TestBody
          (IntegrationTest_TestMultipartUpload_smallfile_Test *this)

{
  bool bVar1;
  uint uVar2;
  char *pcVar3;
  Qiniu_Error QVar4;
  AssertHelper local_258;
  Message local_250;
  int local_244;
  undefined1 local_240 [8];
  AssertionResult gtest_ar_2;
  AssertHelper local_220;
  Message local_218;
  undefined1 local_210 [8];
  AssertionResult gtest_ar_1;
  Message local_1f8 [3];
  int local_1dc;
  undefined1 local_1d8 [8];
  AssertionResult gtest_ar;
  undefined1 local_1b8 [8];
  Qiniu_RS_StatRet statResult;
  char *returnKey;
  char *inputKey;
  char *pcStack_168;
  int i;
  char *keys [3];
  char local_148 [8];
  char smallFileKey [100];
  undefined1 local_d8 [8];
  Qiniu_Mac mac;
  Qiniu_Error err;
  undefined1 local_b0 [8];
  Qiniu_Client client;
  IntegrationTest_TestMultipartUpload_smallfile_Test *this_local;
  
  client._152_8_ = this;
  memset(local_b0,0,0xa0);
  local_d8 = (undefined1  [8])QINIU_ACCESS_KEY;
  mac.accessKey = QINIU_SECRET_KEY;
  Qiniu_Client_InitMacAuth((Qiniu_Client *)local_b0,0x400,(Qiniu_Mac *)local_d8);
  Qiniu_Client_SetTimeout((Qiniu_Client *)local_b0,5000);
  Qiniu_Client_SetConnectTimeout((Qiniu_Client *)local_b0,3000);
  Qiniu_Client_EnableAutoQuery((Qiniu_Client *)local_b0,1);
  uVar2 = rand();
  snprintf(local_148,100,"smallkey_%d",(ulong)uVar2);
  pcStack_168 = local_148;
  keys[0] = "";
  keys[1] = (char *)0x0;
  for (inputKey._4_4_ = 0; inputKey._4_4_ < 3; inputKey._4_4_ = inputKey._4_4_ + 1) {
    pcVar3 = *(char **)(local_148 + (long)(int)inputKey._4_4_ * 8 + -0x20);
    if (pcVar3 != (char *)0x0) {
      Qiniu_RS_Delete((Qiniu_Client *)local_b0,Test_bucket,pcVar3);
    }
    statResult.type =
         (Qiniu_Int64)
         putFile_multipart(Test_bucket,pcVar3,"txt",
                           "/workspace/llm4binary/github/license_c_cmakelists/qiniu[P]c-sdk/gtests/multipart_test.cc"
                           ,0x400000,(Qiniu_Mac *)local_d8);
    QVar4 = Qiniu_RS_Stat((Qiniu_Client *)local_b0,(Qiniu_RS_StatRet *)local_1b8,Test_bucket,
                          (char *)statResult.type);
    gtest_ar.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_4_ = QVar4.code;
    mac.secretKey =
         (char *)CONCAT44(gtest_ar.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl._4_4_,
                          (int)gtest_ar.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl);
    local_1dc = 200;
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((EqHelper *)local_1d8,"err.code","200",(int *)&mac.secretKey,&local_1dc);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d8);
    if (!bVar1) {
      testing::Message::Message(local_1f8);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1d8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/qiniu[P]c-sdk/gtests/multipart_test.cc"
                 ,0x8d,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_1f8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
      testing::Message::~Message(local_1f8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d8);
    testing::internal::CmpHelperSTREQ
              ((internal *)local_210,"statResult.mimeType","\"txt\"",statResult.hash,"txt");
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_210);
    if (!bVar1) {
      testing::Message::Message(&local_218);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_210);
      testing::internal::AssertHelper::AssertHelper
                (&local_220,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/qiniu[P]c-sdk/gtests/multipart_test.cc"
                 ,0x8e,pcVar3);
      testing::internal::AssertHelper::operator=(&local_220,&local_218);
      testing::internal::AssertHelper::~AssertHelper(&local_220);
      testing::Message::~Message(&local_218);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_210);
    QVar4 = Qiniu_RS_Delete((Qiniu_Client *)local_b0,Test_bucket,(char *)statResult.type);
    gtest_ar_2.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_4_ = QVar4.code;
    mac.secretKey =
         (char *)CONCAT44(gtest_ar_2.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl._4_4_,
                          (int)gtest_ar_2.message_._M_t.
                               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               .
                               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                               ._M_head_impl);
    local_244 = 200;
    testing::internal::EqHelper::Compare<int,_int,_nullptr>
              ((EqHelper *)local_240,"err.code","200",(int *)&mac.secretKey,&local_244);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_240);
    if (!bVar1) {
      testing::Message::Message(&local_250);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_240);
      testing::internal::AssertHelper::AssertHelper
                (&local_258,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/qiniu[P]c-sdk/gtests/multipart_test.cc"
                 ,0x92,pcVar3);
      testing::internal::AssertHelper::operator=(&local_258,&local_250);
      testing::internal::AssertHelper::~AssertHelper(&local_258);
      testing::Message::~Message(&local_250);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_240);
  }
  Qiniu_Client_Cleanup((Qiniu_Client *)local_b0);
  return;
}

Assistant:

TEST(IntegrationTest, TestMultipartUpload_smallfile)
{
	Qiniu_Client client;
	Qiniu_Zero(client);

	Qiniu_Error err;
	Qiniu_Mac mac = {QINIU_ACCESS_KEY, QINIU_SECRET_KEY}; // set by env "source test-env.sh"
	Qiniu_Client_InitMacAuth(&client, 1024, &mac);
	Qiniu_Client_SetTimeout(&client, 5000);
	Qiniu_Client_SetConnectTimeout(&client, 3000);
	Qiniu_Client_EnableAutoQuery(&client, Qiniu_True);

	char smallFileKey[100];
	Qiniu_snprintf(smallFileKey, 100, "smallkey_%d", rand());

	const char *keys[] = {
		smallFileKey, // normal keyname
		"",			  // empty string keyname
		NULL};		  // no keyname, determined by server(eg:hash as keyname)
	for (int i = 0; i < sizeof(keys) / sizeof(keys[0]); i++)
	{
		const char *inputKey = keys[i];

		// step1: delete  file if exist
		if (inputKey != NULL)
		{
			Qiniu_RS_Delete(&client, Test_bucket, inputKey);
		}
		// step2: upload file
		const char *returnKey = putFile_multipart(Test_bucket, inputKey, "txt", __FILE__, (4 << 20), &mac); // upload current file

		// step3: stat file
		Qiniu_RS_StatRet statResult;
		err = Qiniu_RS_Stat(&client, &statResult, Test_bucket, returnKey);
		EXPECT_EQ(err.code, 200);
		EXPECT_STREQ(statResult.mimeType, "txt");

		// step4: delete file
		err = Qiniu_RS_Delete(&client, Test_bucket, returnKey);
		EXPECT_EQ(err.code, 200);
	}

	Qiniu_Client_Cleanup(&client);
}